

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

int pzshape::TPZShapeLinear::NConnectShapeF(int side,int order)

{
  int iVar1;
  long *plVar2;
  
  iVar1 = 1;
  if (1 < side) {
    if (side == 2) {
      return order + -1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZShapeLinear::NConnectShapeF, bad parameter side ",0x33);
    plVar2 = (long *)std::ostream::operator<<(&std::cerr,side);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int TPZShapeLinear::NConnectShapeF(int side, int order) {
		if(side<2) return 1;//0 a 4
		if(side<3) return (order-1);//6 a 14
		PZError << "TPZShapeLinear::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}